

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O0

void __thiscall
btSoftColliders::CollideVF_SS::Process(CollideVF_SS *this,btDbvtNode *lnode,btDbvtNode *lface)

{
  long lVar1;
  long lVar2;
  btAlignedObjectArray<btSoftBody::SContact> *this_00;
  long in_RDX;
  long in_RSI;
  float *in_RDI;
  btScalar bVar3;
  float fVar4;
  btVector3 bVar5;
  SContact c;
  btScalar ms;
  btScalar mb;
  btScalar ma;
  btVector3 w;
  Node *n [3];
  btScalar m;
  btScalar d;
  btVector3 p;
  btVector3 o;
  Face *face;
  Node *node;
  btScalar *in_stack_fffffffffffffe98;
  SContact *this_01;
  btVector3 *in_stack_fffffffffffffea8;
  SContact *_Val;
  btVector3 *in_stack_fffffffffffffeb0;
  btVector3 *this_02;
  float local_d0;
  btVector3 *in_stack_ffffffffffffff48;
  btVector3 *in_stack_ffffffffffffff50;
  btVector3 *pbVar6;
  btVector3 *pbVar7;
  float fVar8;
  btVector3 *in_stack_ffffffffffffffb8;
  btVector3 *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_RSI + 0x28);
  lVar2 = *(long *)(in_RDX + 0x28);
  pbVar6 = *(btVector3 **)(lVar1 + 0x10);
  pbVar7 = *(btVector3 **)(lVar1 + 0x18);
  this_02 = (btVector3 *)&stack0xffffffffffffffb8;
  btVector3::btVector3(this_02);
  fVar8 = 3.4028235e+38;
  bVar5 = operator-(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  bVar3 = bVar5.m_floats[3];
  operator-(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  operator-(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  ProjectOrigin(pbVar7,pbVar6,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                (btScalar *)CONCAT44(fVar8,bVar3));
  fVar4 = in_RDI[6];
  operator-(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  bVar3 = btVector3::length((btVector3 *)0x2889a0);
  fVar4 = bVar3 + bVar3 + fVar4;
  if (fVar8 < fVar4 * fVar4) {
    pbVar6 = *(btVector3 **)(lVar2 + 0x10);
    pbVar7 = *(btVector3 **)(lVar2 + 0x18);
    lVar2 = *(long *)(lVar2 + 0x20);
    this_01 = (SContact *)(pbVar6 + 1);
    _Val = (SContact *)(pbVar7 + 1);
    this_00 = (btAlignedObjectArray<btSoftBody::SContact> *)(lVar2 + 0x10);
    operator+((btVector3 *)this_00,(btVector3 *)_Val);
    BaryCoord(pbVar7,pbVar6,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    fVar4 = *(float *)(lVar1 + 0x60);
    local_d0 = BaryEval<float>(in_RDI,this_02->m_floats,(float *)this_00,(btVector3 *)_Val);
    if (((pbVar6[6].m_floats[0] <= 0.0) || (pbVar7[6].m_floats[0] <= 0.0)) ||
       (*(float *)(lVar2 + 0x60) <= 0.0)) {
      local_d0 = 0.0;
    }
    if (0.0 < fVar4 + local_d0) {
      btSoftBody::SContact::SContact(this_01);
      btSqrt(0.0);
      operator/((btVector3 *)this_01,in_stack_fffffffffffffe98);
      btMax<float>((float *)(*(long *)(in_RDI + 2) + 0x194),(float *)(*(long *)(in_RDI + 4) + 0x194)
                  );
      btAlignedObjectArray<btSoftBody::SContact>::push_back(this_00,_Val);
    }
  }
  return;
}

Assistant:

void		Process(const btDbvtNode* lnode,
			const btDbvtNode* lface)
		{
			btSoftBody::Node*	node=(btSoftBody::Node*)lnode->data;
			btSoftBody::Face*	face=(btSoftBody::Face*)lface->data;
			btVector3			o=node->m_x;
			btVector3			p;
			btScalar			d=SIMD_INFINITY;
			ProjectOrigin(	face->m_n[0]->m_x-o,
				face->m_n[1]->m_x-o,
				face->m_n[2]->m_x-o,
				p,d);
			const btScalar	m=mrg+(o-node->m_q).length()*2;
			if(d<(m*m))
			{
				const btSoftBody::Node*	n[]={face->m_n[0],face->m_n[1],face->m_n[2]};
				const btVector3			w=BaryCoord(n[0]->m_x,n[1]->m_x,n[2]->m_x,p+o);
				const btScalar			ma=node->m_im;
				btScalar				mb=BaryEval(n[0]->m_im,n[1]->m_im,n[2]->m_im,w);
				if(	(n[0]->m_im<=0)||
					(n[1]->m_im<=0)||
					(n[2]->m_im<=0))
				{
					mb=0;
				}
				const btScalar	ms=ma+mb;
				if(ms>0)
				{
					btSoftBody::SContact	c;
					c.m_normal		=	p/-btSqrt(d);
					c.m_margin		=	m;
					c.m_node		=	node;
					c.m_face		=	face;
					c.m_weights		=	w;
					c.m_friction	=	btMax(psb[0]->m_cfg.kDF,psb[1]->m_cfg.kDF);
					c.m_cfm[0]		=	ma/ms*psb[0]->m_cfg.kSHR;
					c.m_cfm[1]		=	mb/ms*psb[1]->m_cfg.kSHR;
					psb[0]->m_scontacts.push_back(c);
				}
			}	
		}